

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

uint __thiscall IR::Instr::GetArgOutSize(Instr *this,bool getInterpreterArgOutCount)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  
  OVar1 = this->m_opcode;
  if ((((6 < OVar1 - 0x248) || ((0x65U >> (OVar1 - 0x248 & 0x1f) & 1) == 0)) && (OVar1 != StartCall)
      ) && (OVar1 != LoweredStartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe60,
                       "(opcode == Js::OpCode::StartCall || opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd || opcode == Js::OpCode::InlineNonTrackingBuiltInEnd || opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall)"
                       ,
                       "opcode == Js::OpCode::StartCall || opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd || opcode == Js::OpCode::InlineNonTrackingBuiltInEnd || opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall"
                      );
    if (!bVar3) goto LAB_004c2cde;
    *puVar5 = 0;
  }
  if (getInterpreterArgOutCount && OVar1 != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe62,"(!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall)",
                       "!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall");
    if (!bVar3) {
LAB_004c2cde:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (bVar3) {
    uVar4 = GetAsmJsArgOutSize(this);
    return uVar4;
  }
  uVar4 = GetArgOutCount(this,getInterpreterArgOutCount);
  if (uVar4 < 0x20000000) {
    return uVar4 << 3;
  }
  Math::DefaultOverflowPolicy();
}

Assistant:

uint Instr::GetArgOutSize(bool getInterpreterArgOutCount)
{
    Js::OpCode opcode = this->m_opcode;
    Assert(opcode == Js::OpCode::StartCall ||
        opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd || opcode == Js::OpCode::InlineNonTrackingBuiltInEnd ||
        opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall);

    Assert(!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall);
    if (m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        return GetAsmJsArgOutSize();
    }
    return UInt32Math::Mul<MachPtr>(GetArgOutCount(getInterpreterArgOutCount));
}